

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  ReporterConfig *in_RSI;
  XmlWriter *in_RDI;
  ostream *in_stack_ffffffffffffffc8;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,_config);
  *(undefined ***)in_RDI = &PTR__JunitReporter_0021dbc8;
  ReporterConfig::stream(in_RSI);
  XmlWriter::XmlWriter(in_RDI,in_stack_ffffffffffffffc8);
  Timer::Timer((Timer *)&in_RDI[3].field_0x38);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI[3].m_os);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&in_RDI[9].m_tags);
  in_RDI[2].field_0x30 = 1;
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }